

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomElement __thiscall
QDomNode::previousSiblingElement(QDomNode *this,QString *tagName,QString *namespaceURI)

{
  bool bVar1;
  int iVar2;
  QString *in_RCX;
  long in_FS_OFFSET;
  QDomNode sib;
  QArrayDataPointer<char16_t> QStack_58;
  QDomNode local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  previousSibling(&local_40);
  do {
    if (local_40.impl == (QDomNodePrivate *)0x0) {
      QDomDocument::~QDomDocument((QDomDocument *)&local_40);
      QDomElement::QDomElement((QDomElement *)this);
LAB_0010f4c4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (QDomElement)(QDomNode)this;
      }
      __stack_chk_fail();
    }
    iVar2 = (*(local_40.impl)->_vptr_QDomNodePrivate[0xb])();
    if (iVar2 == 1) {
      if ((in_RCX->d).size != 0) {
        QDomNode::namespaceURI((QString *)&QStack_58,&local_40);
        bVar1 = comparesEqual((QString *)&QStack_58,in_RCX);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
        if (!bVar1) goto LAB_0010f46e;
      }
      this->impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      toElement(this);
      if ((namespaceURI->d).size != 0) {
        QDomElement::tagName((QString *)&QStack_58,(QDomElement *)this);
        bVar1 = comparesEqual((QString *)&QStack_58,namespaceURI);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
        if (!bVar1) {
          QDomDocument::~QDomDocument((QDomDocument *)this);
          goto LAB_0010f46e;
        }
      }
      QDomDocument::~QDomDocument((QDomDocument *)&local_40);
      goto LAB_0010f4c4;
    }
LAB_0010f46e:
    if (local_40.impl == (QDomNodePrivate *)0x0) {
      QDomNode((QDomNode *)&QStack_58);
    }
    else {
      QDomNode((QDomNode *)&QStack_58,(local_40.impl)->prev);
    }
    operator=(&local_40,(QDomNode *)&QStack_58);
    QDomDocument::~QDomDocument((QDomDocument *)&QStack_58);
  } while( true );
}

Assistant:

QDomElement QDomNode::previousSiblingElement(const QString &tagName, const QString &namespaceURI) const
{
    for (QDomNode sib = previousSibling(); !sib.isNull(); sib = sib.previousSibling()) {
        if (sib.isElement() && (namespaceURI.isEmpty() || sib.namespaceURI() == namespaceURI)) {
            QDomElement elt = sib.toElement();
            if (tagName.isEmpty() || elt.tagName() == tagName)
                return elt;
        }
    }
    return QDomElement();
}